

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::PrintLabels(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  char *local_1f8 [4];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allLabels;
  ostringstream cmCTestLog_msg;
  
  allLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &allLabels._M_t._M_impl.super__Rb_tree_header._M_header;
  allLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  allLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  allLabels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  allLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       allLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var2 = (this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->Properties).
       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&allLabels,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (p_Var2[1]._M_parent + 0xc),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               p_Var2[1]._M_parent[0xc]._M_parent);
  }
  if (allLabels._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"No Labels Exist");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x2ef,local_1f8[0],this->Quiet);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"All Labels:");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x2ec,local_1f8[0],this->Quiet);
  }
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  for (p_Var2 = allLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &allLabels._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"  ");
    poVar3 = std::operator<<(poVar3,(string *)(p_Var2 + 1));
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x2f4,local_1f8[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&allLabels._M_t);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::MarkFinished()
{
  std::string fname =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/CTestCheckpoint.txt";
  cmSystemTools::RemoveFile(fname);
}